

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::SectionTemplateNode::WriteHeaderEntries
          (SectionTemplateNode *this,string *outstring,string *filename)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  reference ppTVar4;
  _Self local_68;
  _Self local_60;
  const_iterator iter;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *filename_local;
  string *outstring_local;
  SectionTemplateNode *this_local;
  
  pcVar1 = (this->token_).text;
  uVar2 = (this->token_).textlen;
  local_20 = filename;
  filename_local = outstring;
  outstring_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,uVar2,&local_41);
  anon_unknown_14::WriteOneHeaderEntry(outstring,(string *)local_40,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
       begin(&this->node_list_);
  while( true ) {
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
         end(&this->node_list_);
    bVar3 = std::operator!=(&local_60,&local_68);
    if (!bVar3) break;
    ppTVar4 = std::_List_const_iterator<ctemplate::TemplateNode_*>::operator*(&local_60);
    (*(*ppTVar4)->_vptr_TemplateNode[3])(*ppTVar4,filename_local,local_20);
    std::_List_const_iterator<ctemplate::TemplateNode_*>::operator++(&local_60);
  }
  return;
}

Assistant:

void SectionTemplateNode::WriteHeaderEntries(string *outstring,
                                             const string& filename) const {
  WriteOneHeaderEntry(outstring, string(token_.text, token_.textlen),
                      filename);

  NodeList::const_iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    (*iter)->WriteHeaderEntries(outstring, filename);
  }
}